

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O1

void __thiscall
OpenMD::GreaterThanConstraint<double>::GreaterThanConstraint
          (GreaterThanConstraint<double> *this,double rhs)

{
  stringstream iss;
  long *local_1c0 [2];
  long local_1b0 [2];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>).description_.
  _M_dataplus._M_p =
       (pointer)&(this->super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>).
                 description_.field_2;
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>).description_.
  _M_string_length = 0;
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>).description_.field_2.
  _M_local_buf[0] = '\0';
  this->rhs_ = rhs;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"greater than",0xc);
  std::ostream::_M_insert<double>(rhs);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

GreaterThanConstraint(T rhs) : rhs_(rhs) {
      std::stringstream iss;
      iss << "greater than" << rhs;
      this->description_ = iss.str();
    }